

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O0

void olsrv2_routing_set_domain_parameter(nhdp_domain *domain,olsrv2_routing_domain *parameter)

{
  list_entity *plVar1;
  undefined3 uVar2;
  int iVar3;
  int iVar4;
  olsrv2_routing_domain *poVar5;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  olsrv2_routing_entry *rtentry;
  olsrv2_routing_domain *parameter_local;
  nhdp_domain *domain_local;
  
  iVar4 = memcmp(parameter,_domain_parameter + domain->index,0x14);
  if (iVar4 != 0) {
    iVar4 = domain->index;
    poVar5 = _domain_parameter + iVar4;
    uVar2 = *(undefined3 *)&parameter->field_0x1;
    iVar3 = parameter->protocol;
    poVar5->use_srcip_in_routes = parameter->use_srcip_in_routes;
    *(undefined3 *)&poVar5->field_0x1 = uVar2;
    poVar5->protocol = iVar3;
    iVar3 = parameter->distance;
    _domain_parameter[iVar4].table = parameter->table;
    _domain_parameter[iVar4].distance = iVar3;
    uVar2 = *(undefined3 *)&parameter->field_0x11;
    _domain_parameter[iVar4].source_specific = parameter->source_specific;
    *(undefined3 *)&_domain_parameter[iVar4].field_0x11 = uVar2;
    if (_routing_tree[domain->index].count != 0) {
      for (plVar1 = _routing_tree[domain->index].list_head.next;
          __tempptr = (list_entity *)&plVar1[-0x17].prev,
          plVar1->prev != _routing_tree[domain->index].list_head.prev; plVar1 = plVar1->next) {
        if (((ulong)plVar1[-8].prev & 0x1000000) != 0) {
          *(undefined1 *)((long)&plVar1[-8].prev + 3) = 0;
          if (((ulong)plVar1[-8].prev & 0x100000000) != 0) {
            os_routing_linux_interrupt((os_route *)__tempptr);
            *(undefined1 *)((long)&plVar1[-8].prev + 3) = 0;
          }
          _add_route_to_kernel_queue((olsrv2_routing_entry *)__tempptr);
        }
      }
      _process_kernel_queue();
      oonf_timer_set_ext(&_rate_limit_timer,100,100);
      _trigger_dijkstra = true;
    }
  }
  return;
}

Assistant:

void
olsrv2_routing_set_domain_parameter(struct nhdp_domain *domain, struct olsrv2_routing_domain *parameter) {
  struct olsrv2_routing_entry *rtentry;

  if (memcmp(parameter, &_domain_parameter[domain->index], sizeof(*parameter)) == 0) {
    /* no change */
    return;
  }

  /* copy parameters */
  memcpy(&_domain_parameter[domain->index], parameter, sizeof(*parameter));

  if (avl_is_empty(&_routing_tree[domain->index])) {
    /* no routes present */
    return;
  }

  /* remove old kernel routes */
  avl_for_each_element(&_routing_tree[domain->index], rtentry, _node) {
    if (rtentry->set) {
      rtentry->set = false;

      if (rtentry->in_processing) {
        os_routing_interrupt(&rtentry->route);
        rtentry->set = false;
      }

      _add_route_to_kernel_queue(rtentry);
    }
  }

  _process_kernel_queue();

  /* trigger a dijkstra to write new routes in 100 milliseconds */
  oonf_timer_set(&_rate_limit_timer, 100);
  _trigger_dijkstra = true;
}